

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::DoubleParameter::Clear(DoubleParameter *this)

{
  this->defaultvalue_ = 0.0;
  clear_AllowedValues(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DoubleParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.DoubleParameter)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  defaultvalue_ = 0;
  clear_AllowedValues();
  _internal_metadata_.Clear<std::string>();
}